

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O1

MPP_RET update_curbyte_avs2(BitReadCtx_t *bitctx)

{
  byte *pbVar1;
  
  if (bitctx->bytes_left_ != 0) {
    pbVar1 = bitctx->data_;
    if ((*pbVar1 == 2) && ((short)bitctx->prev_two_bytes_ == 0)) {
      bitctx->curr_byte_ = 0;
      bitctx->num_remaining_bits_in_curr_byte_ = 6;
      bitctx->data_ = pbVar1 + 1;
    }
    else {
      bitctx->data_ = pbVar1 + 1;
      bitctx->curr_byte_ = (ulong)*pbVar1;
      bitctx->num_remaining_bits_in_curr_byte_ = 8;
    }
    bitctx->prev_two_bytes_ = bitctx->prev_two_bytes_ << 8 | bitctx->curr_byte_;
    bitctx->bytes_left_ = bitctx->bytes_left_ - 1;
    return MPP_OK;
  }
  return MPP_ERR_READ_BIT;
}

Assistant:

static MPP_RET update_curbyte_avs2(BitReadCtx_t *bitctx)
{
    if (bitctx->bytes_left_ < 1)
        return MPP_ERR_READ_BIT;

    if (*bitctx->data_ == 0x02 && ((bitctx->prev_two_bytes_ & 0xffff) == 0)) {
        // Detected 0x000002, get 2 bits from next byte
        bitctx->curr_byte_ = 0;
        bitctx->num_remaining_bits_in_curr_byte_ = 6;
        ++bitctx->data_;
    } else {
        bitctx->curr_byte_ = *bitctx->data_++ & 0xff;
        bitctx->num_remaining_bits_in_curr_byte_ = 8;
    }
    // Load a new byte and advance pointers.
    bitctx->prev_two_bytes_ = (bitctx->prev_two_bytes_ << 8) | bitctx->curr_byte_;
    --bitctx->bytes_left_;

    return MPP_OK;
}